

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20250127::container_internal::HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
          (HashSetResizeHelper *this,allocator<char> *param_2,ulong param_3)

{
  RawHashSetLayout layout;
  RawHashSetLayout local_38;
  
  if (this->was_soo_ == true) {
    __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x7ea,"void *absl::container_internal::HashSetResizeHelper::old_slots() const");
  }
  RawHashSetLayout::RawHashSetLayout(&local_38,this->old_capacity_,8,this->had_infoz_);
  if (this->was_soo_ != true) {
    if (param_3 <= ~local_38.slot_offset_ / local_38.capacity_) {
      Deallocate<8ul,std::allocator<char>>
                (param_2,(this->old_heap_or_soo_).heap.control + -local_38.control_offset_,
                 local_38.capacity_ * param_3 + local_38.slot_offset_);
      return;
    }
    __assert_fail("(slot_size <= ((std::numeric_limits<size_t>::max)() - slot_offset_) / capacity_) && \"Try enabling sanitizers.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x4cf,
                  "size_t absl::container_internal::RawHashSetLayout::alloc_size(size_t) const");
  }
  __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x7e6,"ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const");
}

Assistant:

void* old_slots() const {
    ABSL_SWISSTABLE_ASSERT(!was_soo_);
    return old_heap_or_soo_.slot_array().get();
  }